

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<anurbs::Ref<anurbs::BrepLoop>_> * __thiscall
pybind11::class_<anurbs::Ref<anurbs::BrepLoop>>::
def_property_static<pybind11::is_method,pybind11::return_value_policy>
          (class_<anurbs::Ref<anurbs::BrepLoop>> *this,char *name,cpp_function *fget,
          cpp_function *fset,is_method *extra,return_value_policy *extra_1)

{
  function_record *pfVar1;
  char *pcVar2;
  char *doc_prev_1;
  char *doc_prev;
  function_record *rec_active;
  function_record *rec_fset;
  function_record *rec_fget;
  return_value_policy *extra_local_1;
  is_method *extra_local;
  cpp_function *fset_local;
  cpp_function *fget_local;
  char *name_local;
  class_<anurbs::Ref<anurbs::BrepLoop>_> *this_local;
  
  doc_prev = (char *)class_<anurbs::Ref<anurbs::BrepLoop>_>::get_function_record
                               ((fget->super_function).super_object.super_handle.m_ptr);
  pfVar1 = class_<anurbs::Ref<anurbs::BrepLoop>_>::get_function_record
                     ((fset->super_function).super_object.super_handle.m_ptr);
  if ((function_record *)doc_prev != (function_record *)0x0) {
    pcVar2 = ((function_record *)doc_prev)->doc;
    detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
              ((EVP_PKEY_CTX *)extra);
    if ((((function_record *)doc_prev)->doc != (char *)0x0) &&
       (((function_record *)doc_prev)->doc != pcVar2)) {
      free(pcVar2);
      pcVar2 = strdup(((function_record *)doc_prev)->doc);
      ((function_record *)doc_prev)->doc = pcVar2;
    }
  }
  if (pfVar1 != (function_record *)0x0) {
    pcVar2 = pfVar1->doc;
    detail::process_attributes<pybind11::is_method,_pybind11::return_value_policy>::init
              ((EVP_PKEY_CTX *)extra);
    if ((pfVar1->doc != (char *)0x0) && (pfVar1->doc != pcVar2)) {
      free(pcVar2);
      pcVar2 = strdup(pfVar1->doc);
      pfVar1->doc = pcVar2;
    }
    if ((function_record *)doc_prev == (function_record *)0x0) {
      doc_prev = (char *)pfVar1;
    }
  }
  detail::generic_type::def_property_static_impl
            ((generic_type *)this,name,(fget->super_function).super_object.super_handle.m_ptr,
             (fset->super_function).super_object.super_handle.m_ptr,(function_record *)doc_prev);
  return (class_<anurbs::Ref<anurbs::BrepLoop>_> *)this;
}

Assistant:

class_ &def_property_static(const char *name, const cpp_function &fget, const cpp_function &fset, const Extra& ...extra) {
        static_assert( 0 == detail::constexpr_sum(std::is_base_of<arg, Extra>::value...),
                      "Argument annotations are not allowed for properties");
        auto rec_fget = get_function_record(fget), rec_fset = get_function_record(fset);
        auto *rec_active = rec_fget;
        if (rec_fget) {
           char *doc_prev = rec_fget->doc; /* 'extra' field may include a property-specific documentation string */
           detail::process_attributes<Extra...>::init(extra..., rec_fget);
           if (rec_fget->doc && rec_fget->doc != doc_prev) {
              free(doc_prev);
              rec_fget->doc = strdup(rec_fget->doc);
           }
        }
        if (rec_fset) {
            char *doc_prev = rec_fset->doc;
            detail::process_attributes<Extra...>::init(extra..., rec_fset);
            if (rec_fset->doc && rec_fset->doc != doc_prev) {
                free(doc_prev);
                rec_fset->doc = strdup(rec_fset->doc);
            }
            if (! rec_active) rec_active = rec_fset;
        }
        def_property_static_impl(name, fget, fset, rec_active);
        return *this;
    }